

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::ValueIteratorBase::decrement(ValueIteratorBase *this)

{
  std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator--
            (&this->current_);
  return;
}

Assistant:

void ValueIteratorBase::decrement() {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  --current_;
#else
  if (isArray_)
    ValueInternalArray::decrement(iterator_.array_);
  ValueInternalMap::decrement(iterator_.map_);
#endif
}